

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.h
# Opt level: O3

vector<std::shared_ptr<TgBot::InlineKeyboardButton>,_std::allocator<std::shared_ptr<TgBot::InlineKeyboardButton>_>_>
* __thiscall
TgBot::TgTypeParser::parseJsonAndGetArray<TgBot::InlineKeyboardButton>
          (vector<std::shared_ptr<TgBot::InlineKeyboardButton>,_std::allocator<std::shared_ptr<TgBot::InlineKeyboardButton>_>_>
           *__return_storage_ptr__,TgTypeParser *this,
          JsonToTgTypeFunc<TgBot::InlineKeyboardButton> parseFunc,ptree *data)

{
  long *plVar1;
  long lVar2;
  code *pcVar3;
  long lVar4;
  long in_R8;
  shared_ptr<TgBot::InlineKeyboardButton> local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<TgBot::InlineKeyboardButton>,_std::allocator<std::shared_ptr<TgBot::InlineKeyboardButton>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<TgBot::InlineKeyboardButton>,_std::allocator<std::shared_ptr<TgBot::InlineKeyboardButton>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<TgBot::InlineKeyboardButton>,_std::allocator<std::shared_ptr<TgBot::InlineKeyboardButton>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<TgBot::InlineKeyboardButton>,_std::allocator<std::shared_ptr<TgBot::InlineKeyboardButton>_>_>
  ::reserve(__return_storage_ptr__,*(size_type *)(*(long *)(in_R8 + 0x20) + 0x18));
  lVar2 = *(long *)(*(long *)(in_R8 + 0x20) + 8);
  lVar4 = *(long *)(lVar2 + 0x68) + -0x60;
  if (*(long *)(lVar2 + 0x68) == 0) {
    lVar4 = 0;
  }
  if (lVar4 != lVar2) {
    do {
      pcVar3 = (code *)parseFunc;
      if ((parseFunc & 1) != 0) {
        pcVar3 = *(code **)(*(long *)(this + (long)data) + -1 + parseFunc);
      }
      (*pcVar3)(&local_40,this + (long)data,lVar4 + 0x20);
      std::
      vector<std::shared_ptr<TgBot::InlineKeyboardButton>,std::allocator<std::shared_ptr<TgBot::InlineKeyboardButton>>>
      ::emplace_back<std::shared_ptr<TgBot::InlineKeyboardButton>>
                ((vector<std::shared_ptr<TgBot::InlineKeyboardButton>,std::allocator<std::shared_ptr<TgBot::InlineKeyboardButton>>>
                  *)__return_storage_ptr__,&local_40);
      if (local_40.super___shared_ptr<TgBot::InlineKeyboardButton,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.
                   super___shared_ptr<TgBot::InlineKeyboardButton,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      plVar1 = (long *)(lVar4 + 0x68);
      lVar4 = *plVar1 + -0x60;
      if (*plVar1 == 0) {
        lVar4 = 0;
      }
    } while (lVar4 != lVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<T>> parseJsonAndGetArray(JsonToTgTypeFunc<T> parseFunc, const boost::property_tree::ptree& data) const {
        std::vector<std::shared_ptr<T>> result;
        result.reserve(data.size());
        for (const std::pair<const std::string, boost::property_tree::ptree>& innerTreeItem : data) {
            result.push_back((this->*parseFunc)(innerTreeItem.second));
        }
        return result;
    }